

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMpiHandshake.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* adios2::helper::HandshakeRank
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,string *filename,char mode,int timeoutSeconds,
            MPI_Comm localComm,int verbosity)

{
  pointer pcVar1;
  iterator iVar2;
  int *piVar3;
  char *pcVar4;
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  vector<int,std::allocator<int>> *this;
  long *plVar8;
  long lVar9;
  istream *piVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  ostream *poVar14;
  undefined8 uVar15;
  long *plVar16;
  pointer piVar17;
  vector<int,_std::allocator<int>_> *this_00;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *pvVar18;
  int i_2;
  pointer piVar19;
  pointer *ppiVar20;
  int *j;
  string line;
  int localRank;
  string local_6d8;
  vector<int,_std::allocator<int>_> *local_6b8;
  int worldRank;
  string local_6a8;
  int local_688;
  int localSize;
  vector<int,_std::allocator<int>_> allLocalRanks;
  int worldSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  ifstream fs_1;
  undefined4 uStack_634;
  long local_628;
  long lStack_620;
  ios_base local_5b8 [392];
  int dims [3];
  undefined1 local_420 [232];
  ios_base local_338 [264];
  ofstream fs;
  long local_228;
  char local_220 [232];
  ios_base local_138 [264];
  
  this = (vector<int,std::allocator<int>> *)operator_new(0x48);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(this + 0x48);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)(this + 0x48);
  MPI_Comm_rank(localComm,&localRank);
  MPI_Comm_size(localComm,&localSize);
  MPI_Comm_rank(&ompi_mpi_comm_world,&worldRank);
  MPI_Comm_size(&ompi_mpi_comm_world,&worldSize);
  std::vector<int,_std::allocator<int>_>::vector
            (&allLocalRanks,(long)localSize,(allocator_type *)&fs_1);
  MPI_Gather(&worldRank,1,&ompi_mpi_int,
             allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,1,&ompi_mpi_int,0,localComm);
  local_688 = verbosity;
  if (localRank != 0) goto LAB_0012fb0c;
  std::ofstream::ofstream(&fs);
  pcVar1 = (filename->_M_dataplus)._M_p;
  dims._0_8_ = local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)dims,pcVar1,pcVar1 + filename->_M_string_length);
  std::__cxx11::string::append((char *)dims);
  plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)dims,stack0xfffffffffffffbd8,0,'\x01');
  _fs_1 = &local_628;
  plVar16 = plVar8 + 2;
  if ((long *)*plVar8 == plVar16) {
    local_628 = *plVar16;
    lStack_620 = plVar8[3];
  }
  else {
    local_628 = *plVar16;
    _fs_1 = (long *)*plVar8;
  }
  *plVar8 = (long)plVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::open((string *)&fs,(_Ios_Openmode)&fs_1);
  if (_fs_1 != &local_628) {
    operator_delete(_fs_1);
  }
  local_6b8 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_6b8._4_4_,timeoutSeconds);
  if ((undefined1 *)dims._0_8_ != local_420) {
    operator_delete((void *)dims._0_8_);
  }
  piVar17 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar19 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      plVar8 = (long *)std::ostream::operator<<((ostream *)&fs,*piVar19);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      piVar19 = piVar19 + 1;
    } while (piVar19 != piVar17);
  }
  std::ofstream::close();
  if (mode == 'r') {
    if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar17 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        _fs_1 = (long *)CONCAT44(uStack_634,*piVar17);
        iVar2._M_current = *(int **)(this + 8);
        if (iVar2._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,iVar2,(int *)&fs_1);
        }
        else {
          *iVar2._M_current = *piVar17;
          *(int **)(this + 8) = iVar2._M_current + 1;
        }
        iVar2._M_current = *(int **)(this + 0x38);
        if (iVar2._M_current == *(int **)(this + 0x40)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this + 0x30,iVar2,(int *)&fs_1);
        }
        else {
          *iVar2._M_current = _fs_1;
          *(int **)(this + 0x38) = iVar2._M_current + 1;
        }
        piVar17 = piVar17 + 1;
      } while (piVar17 !=
               allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::ofstream::ofstream(dims);
    pcVar1 = (filename->_M_dataplus)._M_p;
    _fs_1 = &local_628;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_1,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&fs_1);
    std::ofstream::open((string *)dims,(_Ios_Openmode)(string *)&fs_1);
    if (_fs_1 != &local_628) {
      operator_delete(_fs_1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dims,"completed",9);
    std::ofstream::close();
    lVar12 = std::chrono::_V2::system_clock::now();
    local_6b8 = (vector<int,_std::allocator<int>_> *)(long)(int)local_6b8;
    do {
      std::ifstream::ifstream((string *)&fs_1);
      lVar9 = std::chrono::_V2::system_clock::now();
      if ((long)local_6b8 < (lVar9 - lVar12) / 1000000000) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&line,"Helper","");
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"adiosMpiHandshake","")
        ;
        local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"HandshakeRank","");
        std::operator+(&local_658,"Mpi handshake timeout for Stream ",filename);
        Throw<std::runtime_error>(&line,&local_6d8,&local_6a8,&local_658,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != &local_658.field_2) {
          operator_delete(local_658._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
          operator_delete(local_6a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
      }
      line._M_dataplus._M_p = (pointer)&line.field_2;
      pcVar1 = (filename->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&line);
      std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p);
      }
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      cVar6 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&fs_1,(string *)&line,cVar6);
      iVar7 = std::__cxx11::string::compare((char *)&line);
      if (iVar7 == 0) {
        std::ifstream::close();
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        pcVar1 = (filename->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6d8,pcVar1,pcVar1 + filename->_M_string_length);
        std::__cxx11::string::append((char *)&local_6d8);
        remove(local_6d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p);
      }
      std::ifstream::~ifstream((string *)&fs_1);
    } while (iVar7 != 0);
    std::ifstream::ifstream(&fs_1);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&line);
    std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != &line.field_2) {
      operator_delete(line._M_dataplus._M_p);
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar6 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&fs_1,(string *)&line,cVar6);
      _Var5 = line._M_dataplus;
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
      pvVar18 = (__return_storage_ptr__->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      piVar11 = __errno_location();
      iVar7 = *piVar11;
      *piVar11 = 0;
      lVar12 = strtol(_Var5._M_p,(char **)&local_6d8,10);
      if (local_6d8._M_dataplus._M_p == _Var5._M_p) {
        std::__throw_invalid_argument("stoi");
LAB_0012fd74:
        std::__throw_out_of_range("stoi");
LAB_0012fd80:
        std::__throw_invalid_argument("stoi");
LAB_0012fd8c:
        std::__throw_out_of_range("stoi");
        goto LAB_0012fd98;
      }
      if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0012fd74;
      if (*piVar11 == 0) {
        *piVar11 = iVar7;
      }
      local_6a8._M_dataplus._M_p._0_4_ = (int)lVar12;
      iVar2._M_current =
           (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar18,iVar2,(int *)&local_6a8);
      }
      else {
        *iVar2._M_current = (int)lVar12;
        (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      _Var5._M_p = line._M_dataplus._M_p;
      iVar7 = *piVar11;
      *piVar11 = 0;
      lVar12 = strtol(line._M_dataplus._M_p,(char **)&local_6d8,10);
      if (local_6d8._M_dataplus._M_p == _Var5._M_p) goto LAB_0012fd80;
      if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0012fd8c;
      if (*piVar11 == 0) {
        *piVar11 = iVar7;
      }
      local_6a8._M_dataplus._M_p._0_4_ = (int)lVar12;
      iVar2._M_current =
           pvVar18[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          pvVar18[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar18 + 1,iVar2,(int *)&local_6a8);
      }
      else {
        *iVar2._M_current = (int)lVar12;
        pvVar18[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != &line.field_2) {
      operator_delete(line._M_dataplus._M_p);
    }
    std::ifstream::close();
    line._M_dataplus._M_p = (pointer)&line.field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&line);
    remove(line._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != &line.field_2) {
      operator_delete(line._M_dataplus._M_p);
    }
LAB_0012fa39:
    std::ifstream::~ifstream(&fs_1);
    uVar15 = _RegisterEngine;
    pcVar4 = _VTT;
    dims._0_8_ = _VTT;
    *(undefined8 *)((long)dims + *(long *)(_VTT + -0x18)) = _RegisterEngine;
    std::filebuf::~filebuf((filebuf *)(dims + 2));
    std::ios_base::~ios_base(local_338);
    _fs = pcVar4;
  }
  else {
    _fs = _VTT;
    uVar15 = _RegisterEngine;
    if (mode == 'w') {
      if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        piVar17 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          _fs_1 = (long *)CONCAT44(uStack_634,*piVar17);
          iVar2._M_current = *(int **)(this + 8);
          if (iVar2._M_current == *(int **)(this + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this,iVar2,(int *)&fs_1);
          }
          else {
            *iVar2._M_current = *piVar17;
            *(int **)(this + 8) = iVar2._M_current + 1;
          }
          iVar2._M_current = *(int **)(this + 0x20);
          if (iVar2._M_current == *(int **)(this + 0x28)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this + 0x18,iVar2,(int *)&fs_1);
          }
          else {
            *iVar2._M_current = _fs_1;
            *(int **)(this + 0x20) = iVar2._M_current + 1;
          }
          piVar17 = piVar17 + 1;
        } while (piVar17 !=
                 allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::ofstream::ofstream(dims);
      pcVar1 = (filename->_M_dataplus)._M_p;
      _fs_1 = &local_628;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fs_1,pcVar1,pcVar1 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&fs_1);
      std::ofstream::open((string *)dims,(_Ios_Openmode)(string *)&fs_1);
      if (_fs_1 != &local_628) {
        operator_delete(_fs_1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dims,"completed",9);
      std::ofstream::close();
      do {
        std::ifstream::ifstream((string *)&fs_1);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        pcVar1 = (filename->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
        std::__cxx11::string::append((char *)&line);
        std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        cVar6 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fs_1,(string *)&line,cVar6);
        iVar7 = std::__cxx11::string::compare((char *)&line);
        if (iVar7 == 0) {
          std::ifstream::close();
          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
          pcVar1 = (filename->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6d8,pcVar1,pcVar1 + filename->_M_string_length);
          std::__cxx11::string::append((char *)&local_6d8);
          remove(local_6d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
            operator_delete(local_6d8._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        std::ifstream::~ifstream((string *)&fs_1);
      } while (iVar7 != 0);
      std::ifstream::ifstream(&fs_1);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      pcVar1 = (filename->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&line);
      std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p);
      }
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar6 = std::ios::widen((char)_fs_1[-3] + (char)(string *)&fs_1);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&fs_1,(string *)&line,cVar6);
        _Var5 = line._M_dataplus;
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
        pvVar18 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        piVar11 = __errno_location();
        iVar7 = *piVar11;
        *piVar11 = 0;
        lVar12 = strtol(_Var5._M_p,(char **)&local_6d8,10);
        if (local_6d8._M_dataplus._M_p == _Var5._M_p) goto LAB_0012fdb0;
        if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0012fdbc;
        if (*piVar11 == 0) {
          *piVar11 = iVar7;
        }
        local_6a8._M_dataplus._M_p._0_4_ = (int)lVar12;
        iVar2._M_current =
             (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pvVar18,iVar2,(int *)&local_6a8);
        }
        else {
          *iVar2._M_current = (int)lVar12;
          (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        _Var5._M_p = line._M_dataplus._M_p;
        iVar7 = *piVar11;
        *piVar11 = 0;
        lVar12 = strtol(line._M_dataplus._M_p,(char **)&local_6d8,10);
        if (local_6d8._M_dataplus._M_p == _Var5._M_p) goto LAB_0012fd98;
        if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0012fda4;
        if (*piVar11 == 0) {
          *piVar11 = iVar7;
        }
        local_6a8._M_dataplus._M_p._0_4_ = (int)lVar12;
        iVar2._M_current =
             pvVar18[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            pvVar18[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pvVar18 + 2,iVar2,(int *)&local_6a8);
        }
        else {
          *iVar2._M_current = (int)lVar12;
          pvVar18[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p);
      }
      std::ifstream::close();
      line._M_dataplus._M_p = (pointer)&line.field_2;
      pcVar1 = (filename->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&line,pcVar1,pcVar1 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&line);
      remove(line._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p);
      }
      goto LAB_0012fa39;
    }
  }
  *(undefined8 *)(&fs + *(long *)(_fs + -0x18)) = uVar15;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (localRank == 0) {
    ppiVar20 = (pointer *)
               ((long)&(((__return_storage_ptr__->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + 8);
    lVar12 = 0;
    do {
      piVar17 = ((_Vector_impl_data *)(ppiVar20 + -1))->_M_start;
      piVar19 = *ppiVar20;
      uVar13 = (long)piVar19 - (long)piVar17 >> 2;
      dims[lVar12] = (int)uVar13;
      if (piVar19 != piVar17) {
        lVar9 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar17,piVar19,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar17,piVar19);
      }
      lVar12 = lVar12 + 1;
      ppiVar20 = ppiVar20 + 3;
    } while (lVar12 != 3);
  }
LAB_0012fb0c:
  MPI_Bcast(dims,3,&ompi_mpi_int,0,localComm);
  pvVar18 = (__return_storage_ptr__->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (localRank != 0) {
    lVar12 = 0;
    this_00 = pvVar18;
    do {
      std::vector<int,_std::allocator<int>_>::resize(this_00,(long)dims[lVar12]);
      lVar12 = lVar12 + 1;
      this_00 = this_00 + 1;
    } while (lVar12 != 3);
  }
  lVar12 = 8;
  do {
    lVar9 = *(long *)((long)pvVar18 + lVar12 + -8);
    MPI_Bcast(lVar9,(ulong)(*(long *)((long)&(pvVar18->super__Vector_base<int,_std::allocator<int>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar12) -
                           lVar9) >> 2,&ompi_mpi_int,0,localComm);
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x50);
  if (4 < local_688) {
    std::__cxx11::stringstream::stringstream((stringstream *)&fs_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,"World Rank ",0xb);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&local_628,worldRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    local_6b8 = (__return_storage_ptr__->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar18 != local_6b8) {
      iVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,"    ",4);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&local_628,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
        piVar3 = (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar11 = (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&local_628,*piVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
        }
        cVar6 = (char)(ostream *)&local_628;
        std::ios::widen((char)*(undefined8 *)(local_628 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        iVar7 = iVar7 + 1;
        pvVar18 = pvVar18 + 1;
      } while (pvVar18 != local_6b8);
    }
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_fs,local_228);
    if (_fs != local_220) {
      operator_delete(_fs);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&fs_1);
    std::ios_base::~ios_base(local_5b8);
  }
  if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
LAB_0012fd98:
  std::__throw_invalid_argument("stoi");
LAB_0012fda4:
  std::__throw_out_of_range("stoi");
LAB_0012fdb0:
  std::__throw_invalid_argument("stoi");
LAB_0012fdbc:
  uVar15 = std::__throw_out_of_range("stoi");
  std::ifstream::~ifstream(&fs_1);
  std::ofstream::~ofstream(dims);
  std::ofstream::~ofstream(&fs);
  if (allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(__return_storage_ptr__);
  _Unwind_Resume(uVar15);
}

Assistant:

const std::vector<std::vector<int>> HandshakeRank(const std::string &filename, const char mode,
                                                  const int timeoutSeconds, MPI_Comm localComm,
                                                  int verbosity)
{
    std::vector<std::vector<int>> ret(3);

    int localRank;
    int localSize;
    int worldRank;
    int worldSize;

    MPI_Comm_rank(localComm, &localRank);
    MPI_Comm_size(localComm, &localSize);

    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    std::vector<int> allLocalRanks(localSize);

    MPI_Gather(&worldRank, 1, MPI_INT, allLocalRanks.data(), 1, MPI_INT, 0, localComm);

    if (localRank == 0)
    {
        std::ofstream fs;
        fs.open(filename + "." + mode);
        for (auto rank : allLocalRanks)
        {
            fs << rank << std::endl;
        }
        fs.close();

        if (mode == 'r')
        {

            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[2].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".r.c");
            fsc << "completed";
            fsc.close();

            auto startTime = std::chrono::system_clock::now();
            while (true)
            {
                std::ifstream fs;
                try
                {
                    auto nowTime = std::chrono::system_clock::now();
                    auto duration =
                        std::chrono::duration_cast<std::chrono::seconds>(nowTime - startTime);
                    if (duration.count() > timeoutSeconds)
                    {
                        helper::Throw<std::runtime_error>(
                            "Helper", "adiosMpiHandshake", "HandshakeRank",
                            "Mpi handshake timeout for Stream " + filename);
                    }

                    fs.open(filename + ".w.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".w.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".w");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[1].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".w\0").c_str());
        }
        else if (mode == 'w')
        {
            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[1].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".w.c");
            fsc << "completed";
            fsc.close();

            while (true)
            {
                std::ifstream fs;
                try
                {
                    fs.open(filename + ".r.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".r.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".r");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[2].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".r\0").c_str());
        }
    }

    int dims[3];

    if (localRank == 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            dims[i] = static_cast<int>(ret[i].size());
            std::sort(ret[i].begin(), ret[i].end());
        }
    }

    MPI_Bcast(dims, 3, MPI_INT, 0, localComm);

    if (localRank != 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            ret[i].resize(dims[i]);
        }
    }

    for (int i = 0; i < 3; ++i)
    {
        MPI_Bcast(ret[i].data(), static_cast<int>(ret[i].size()), MPI_INT, 0, localComm);
    }

    if (verbosity >= 5)
    {
        std::stringstream output;
        output << "World Rank " << worldRank << ": " << std::endl;
        int s = 0;
        for (const auto &i : ret)
        {
            output << "    " << s << ": ";
            for (const auto &j : i)
            {
                output << j << ", ";
            }
            output << std::endl;
            ++s;
        }
        std::cout << output.str();
    }

    return ret;
}